

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmShiftEa<(moira::Instr)70,(moira::Mode)5,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  undefined2 in_CX;
  StrWriter *in_RSI;
  u32 *in_RDI;
  Ea<(moira::Mode)5,_(moira::Size)2> src;
  u16 in_stack_ffffffffffffffce;
  Moira *in_stack_ffffffffffffffd0;
  Ea<(moira::Mode)5,_(moira::Size)2> *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  
  Op<(moira::Mode)5,(moira::Size)2>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffce,in_RDI);
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  StrWriter::operator<<(pSVar1,(Align)in_RDI[5]);
  StrWriter::operator<<
            ((StrWriter *)CONCAT26(in_CX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void
Moira::dasmShiftEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src;
}